

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall
llm_graph_input_attn_no_cache::set_input(llm_graph_input_attn_no_cache *this,llama_ubatch *ubatch)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  llama_seq_id **pplVar6;
  int32_t *piVar7;
  llama_hparams *plVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int s0;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  int s0_1;
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong local_98;
  ulong local_80;
  
  if (this->kq_mask != (ggml_tensor *)0x0) {
    bVar1 = this->cparams->causal_attn;
    uVar2 = ubatch->n_tokens;
    uVar15 = (ulong)uVar2;
    uVar3 = ubatch->n_seq_tokens;
    uVar25 = (ulong)uVar3;
    uVar16 = (ulong)ubatch->n_seqs;
    cVar12 = ggml_backend_buffer_is_host(this->kq_mask->buffer);
    auVar11 = _DAT_002360d0;
    auVar10 = _DAT_002360c0;
    auVar9 = _DAT_002360b0;
    if (bVar1 == true) {
      if (cVar12 == '\0') {
        uVar19 = 0x154;
LAB_001aa02a:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,uVar19,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(kq_mask->buffer)");
      }
      if (uVar16 != 0) {
        pvVar5 = this->kq_mask->data;
        pplVar6 = ubatch->seq_id;
        local_98 = 0;
        do {
          if (uVar25 != 0) {
            iVar14 = *pplVar6[local_98];
            piVar7 = ubatch->n_seq_id;
            uVar18 = 0;
            do {
              lVar24 = (long)(int)((int)local_98 * uVar3 + (int)uVar18);
              uVar17 = 0;
              do {
                uVar2 = piVar7[uVar17];
                plVar8 = this->hparams;
                uVar20 = 0;
                do {
                  lVar23 = (long)(int)((int)uVar20 + (int)uVar17 * uVar3);
                  fVar30 = -INFINITY;
                  if (0 < (int)uVar2) {
                    uVar27 = 0;
                    do {
                      if ((pplVar6[uVar17][uVar27] == iVar14) &&
                         (iVar4 = ubatch->pos[lVar23], iVar13 = ubatch->pos[lVar24],
                         iVar22 = iVar4 - iVar13, iVar22 == 0 || iVar4 < iVar13)) {
                        fVar30 = 0.0;
                        if (plVar8->use_alibi == true) {
                          iVar4 = -iVar22;
                          if (iVar22 < 1) {
                            iVar4 = iVar22;
                          }
                          fVar30 = (float)iVar4;
                        }
                        break;
                      }
                      uVar27 = uVar27 + 1;
                    } while (uVar2 != uVar27);
                  }
                  *(float *)((long)pvVar5 + lVar23 * 4 + lVar24 * uVar15 * 4) = fVar30;
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar25);
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar16);
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar25);
          }
          local_98 = local_98 + 1;
        } while (local_98 != uVar16);
      }
    }
    else {
      if (cVar12 == '\0') {
        uVar19 = 0x17a;
        goto LAB_001aa02a;
      }
      if (uVar16 != 0) {
        pvVar5 = this->kq_mask->data;
        pplVar6 = ubatch->seq_id;
        lVar23 = (long)(int)uVar2;
        lVar24 = (uVar15 - lVar23) + -1;
        auVar29._8_4_ = (int)lVar24;
        auVar29._0_8_ = lVar24;
        auVar29._12_4_ = (int)((ulong)lVar24 >> 0x20);
        iVar14 = 0;
        auVar29 = auVar29 ^ _DAT_002360d0;
        local_80 = 0;
        do {
          if (uVar25 != 0) {
            iVar4 = *pplVar6[local_80];
            piVar7 = ubatch->n_seq_id;
            uVar18 = 0;
            iVar13 = iVar14;
            do {
              lVar24 = (long)iVar13 * uVar15 * 4 + lVar23 * 4 + 0xc;
              lVar21 = (long)(int)((int)local_80 * uVar3 + (int)uVar18);
              uVar17 = 0;
              do {
                uVar2 = piVar7[uVar17];
                plVar8 = this->hparams;
                uVar20 = 0;
                do {
                  lVar28 = (long)(int)((int)uVar20 + (int)uVar17 * uVar3);
                  fVar30 = -INFINITY;
                  if (0 < (int)uVar2) {
                    uVar27 = 0;
                    do {
                      if (pplVar6[uVar17][uVar27] == iVar4) {
                        fVar30 = 0.0;
                        if (plVar8->use_alibi == true) {
                          iVar26 = ubatch->pos[lVar28] - ubatch->pos[lVar21];
                          iVar22 = -iVar26;
                          if (iVar26 < 1) {
                            iVar22 = iVar26;
                          }
                          fVar30 = (float)iVar22;
                        }
                        goto LAB_001a9eba;
                      }
                      uVar27 = uVar27 + 1;
                    } while (uVar2 != uVar27);
                    fVar30 = -INFINITY;
                  }
LAB_001a9eba:
                  *(float *)((long)pvVar5 + lVar28 * 4 + lVar21 * uVar15 * 4) = fVar30;
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar25);
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar16);
              if (lVar23 < (long)uVar15) {
                uVar17 = 0;
                do {
                  auVar31._8_4_ = (int)uVar17;
                  auVar31._0_8_ = uVar17;
                  auVar31._12_4_ = (int)(uVar17 >> 0x20);
                  auVar32 = (auVar31 | auVar10) ^ auVar11;
                  iVar22 = auVar29._4_4_;
                  if ((bool)(~(iVar22 < auVar32._4_4_ ||
                              auVar29._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar22) & 1)) {
                    *(undefined4 *)((long)pvVar5 + uVar17 * 4 + lVar24 + -0xc) = 0xff800000;
                  }
                  if (auVar32._12_4_ <= auVar29._12_4_ &&
                      (auVar32._8_4_ <= auVar29._8_4_ || auVar32._12_4_ != auVar29._12_4_)) {
                    *(undefined4 *)((long)pvVar5 + uVar17 * 4 + lVar24 + -8) = 0xff800000;
                  }
                  auVar31 = (auVar31 | auVar9) ^ auVar11;
                  iVar26 = auVar31._4_4_;
                  if (iVar26 <= iVar22 && (iVar26 != iVar22 || auVar31._0_4_ <= auVar29._0_4_)) {
                    *(undefined4 *)((long)pvVar5 + uVar17 * 4 + lVar24 + -4) = 0xff800000;
                    *(undefined4 *)((long)pvVar5 + uVar17 * 4 + lVar24) = 0xff800000;
                  }
                  uVar17 = uVar17 + 4;
                } while (((uVar15 - lVar23) + 3 & 0xfffffffffffffffc) != uVar17);
              }
              uVar18 = uVar18 + 1;
              iVar13 = iVar13 + 1;
            } while (uVar18 != uVar25);
          }
          local_80 = local_80 + 1;
          iVar14 = iVar14 + uVar3;
        } while (local_80 != uVar16);
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_no_cache::set_input(const llama_ubatch * ubatch) {
    if (kq_mask) {
        if (cparams.causal_attn) {
            const int64_t n_kv         = ubatch->n_tokens;
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));
            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id && ubatch->pos[ti] <= ubatch->pos[tj]) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_kv*n_tokens) + tj*n_kv + ti] = f;
                            }
                        }
                    }
                }
            }
        } else {
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;
            const int64_t n_stride     = ubatch->n_tokens;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));

            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_tokens*n_tokens) + tj*n_stride + ti] = f;
                            }
                        }

                        for (int i = n_tokens; i < n_stride; ++i) {
                            data[h*(n_tokens*n_tokens) + tj*n_stride + i] = -INFINITY;
                        }
                    }
                }
            }
        }
    }
}